

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzeqnarray.cpp
# Opt level: O0

void __thiscall
TPZEqnArray<std::complex<long_double>_>::Read
          (TPZEqnArray<std::complex<long_double>_> *this,FILE *inputfile)

{
  int iVar1;
  int *piVar2;
  complex<long_double> *__ptr;
  FILE *in_RSI;
  undefined4 *in_RDI;
  TPZManVector<int,_1000> *unaff_retaddr;
  int aux;
  int64_t sizereturn;
  int64_t in_stack_00000058;
  TPZManVector<std::complex<long_double>,_1000> *in_stack_00000060;
  int local_1c;
  size_t local_18;
  FILE *local_10;
  undefined4 *newsize;
  
  local_18 = 0;
  local_10 = in_RSI;
  newsize = in_RDI;
  local_18 = fread(in_RDI + 1,4,1,in_RSI);
  local_18 = fread(in_RDI + 0x2414,4,1,local_10);
  local_1c = 0;
  local_18 = fread(&local_1c,4,1,local_10);
  TPZManVector<int,_100>::Resize((TPZManVector<int,_100> *)unaff_retaddr,(int64_t)newsize);
  piVar2 = TPZVec<int>::operator[]((TPZVec<int> *)(in_RDI + 2),0);
  local_18 = fread(piVar2,4,(long)local_1c,local_10);
  local_18 = fread(&local_1c,4,1,local_10);
  TPZManVector<int,_100>::Resize((TPZManVector<int,_100> *)unaff_retaddr,(int64_t)newsize);
  piVar2 = TPZVec<int>::operator[]((TPZVec<int> *)(in_RDI + 0x6e),0);
  local_18 = fread(piVar2,4,(long)local_1c,local_10);
  local_18 = fread(&local_1c,4,1,local_10);
  TPZManVector<int,_1000>::Resize(unaff_retaddr,(int64_t)newsize);
  piVar2 = TPZVec<int>::operator[]((TPZVec<int> *)(in_RDI + 0x2024),0);
  local_18 = fread(piVar2,4,(long)local_1c,local_10);
  local_18 = fread(&local_1c,4,1,local_10);
  TPZManVector<std::complex<long_double>,_1000>::Resize(in_stack_00000060,in_stack_00000058);
  __ptr = TPZVec<std::complex<long_double>_>::operator[]
                    ((TPZVec<std::complex<long_double>_> *)(in_RDI + 0xdc),0);
  local_18 = fread(__ptr,8,(long)local_1c,local_10);
  *in_RDI = 1;
  if ((in_RDI[1] != 0) && ((int)in_RDI[1] % 2 == 0)) {
    piVar2 = TPZVec<int>::operator[]((TPZVec<int> *)(in_RDI + 0x6e),0);
    iVar1 = *piVar2;
    piVar2 = TPZVec<int>::operator[]((TPZVec<int> *)(in_RDI + 0x6e),1);
    if (iVar1 == *piVar2) {
      *in_RDI = 2;
    }
  }
  return;
}

Assistant:

void TPZEqnArray<TVar>::Read(FILE * inputfile) {
	int64_t sizereturn;
	sizereturn = 0;
	/** Number of equations */
	sizereturn = fread(&fNumEq,sizeof(int),1,inputfile);
#ifdef PZDEBUG
	if (sizereturn != 1) DebugStop();
#endif
	/** Last term added*/
	sizereturn = fread(&fLastTerm,sizeof(int),1,inputfile);
#ifdef PZDEBUG
	if (sizereturn != 1) DebugStop();
#endif
	int aux=0;
	/** TPZStack fEqStart data */
	sizereturn = fread(&aux,sizeof(int),1,inputfile);
#ifdef PZDEBUG
	if (sizereturn != 1) DebugStop();
#endif
	fEqStart.Resize(aux);
	sizereturn = fread(&fEqStart[0],sizeof(int), aux ,inputfile);
#ifdef PZDEBUG
	if (sizereturn != aux) DebugStop();
#endif
	/** TPZStack fEqNumber data */
	sizereturn = fread(&aux,sizeof(int),1,inputfile);
#ifdef PZDEBUG
	if (sizereturn != 1) DebugStop();
#endif
	fEqNumber.Resize(aux);
	sizereturn = fread(&fEqNumber[0],sizeof(int), aux ,inputfile);
#ifdef PZDEBUG
	if (sizereturn != aux) DebugStop();
#endif
	/** TPZStack fIndex data */
	sizereturn = fread(&aux,sizeof(int),1,inputfile);
#ifdef PZDEBUG
	if (sizereturn != 1) DebugStop();
#endif
	fIndex.Resize(aux);
	sizereturn = fread(&fIndex[0],sizeof(int), aux ,inputfile);
#ifdef PZDEBUG
	if (sizereturn != aux) DebugStop();
#endif
	/** TPZStack fEqValues data */
	sizereturn = fread(&aux,sizeof(int),1,inputfile);
#ifdef PZDEBUG
	if (sizereturn != 1) DebugStop();
#endif
	fEqValues.Resize(aux);
	sizereturn = fread(&fEqValues[0],sizeof(REAL), aux ,inputfile);
#ifdef PZDEBUG
	if (sizereturn != aux) DebugStop();
#endif
	
	this->fSymmetric = EIsSymmetric;
	if(fNumEq && fNumEq%2==0 && fEqNumber[0]==fEqNumber[1]) fSymmetric = EIsNonSymmetric;
}